

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_14::FieldIndexSorter::operator()
          (FieldIndexSorter *this,FieldDescriptor *left,FieldDescriptor *right)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int __c;
  int __c_00;
  FieldDescriptor *__s;
  FieldDescriptor *right_local;
  FieldDescriptor *left_local;
  FieldIndexSorter *this_local;
  
  __s = left;
  bVar1 = FieldDescriptor::is_extension(left);
  if ((bVar1) && (bVar1 = FieldDescriptor::is_extension(right), bVar1)) {
    iVar2 = FieldDescriptor::number(left);
    iVar3 = FieldDescriptor::number(right);
    this_local._7_1_ = iVar2 < iVar3;
  }
  else {
    bVar1 = FieldDescriptor::is_extension(left);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = FieldDescriptor::is_extension(right);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        pcVar4 = FieldDescriptor::index(left,(char *)__s,__c);
        pcVar5 = FieldDescriptor::index(right,(char *)__s,__c_00);
        this_local._7_1_ = (int)pcVar4 < (int)pcVar5;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const FieldDescriptor* left,
                  const FieldDescriptor* right) const {
    if (left->is_extension() && right->is_extension()) {
      return left->number() < right->number();
    } else if (left->is_extension()) {
      return false;
    } else if (right->is_extension()) {
      return true;
    } else {
      return left->index() < right->index();
    }
  }